

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ImportInfo *pIVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string fileName;
  string frameworkName;
  RegularExpressionMatch match;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  char *local_138;
  size_t local_130;
  char local_128;
  undefined7 uStack_127;
  Names local_118;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  
  bVar3 = cmTarget::IsImported(this->Target);
  if (!bVar3) {
    GetLibraryNames(&local_118,this,config);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_118.SharedObject.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.SharedObject._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_118.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_118.SharedObject.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_118.SharedObject.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_118.SharedObject._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_118.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_118.SharedObject.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_118.SharedObject._M_string_length;
    local_118.SharedObject._M_string_length = 0;
    local_118.SharedObject.field_2._M_local_buf[0] = '\0';
    local_118.SharedObject._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.PDB._M_dataplus._M_p != &local_118.PDB.field_2) {
      operator_delete(local_118.PDB._M_dataplus._M_p,local_118.PDB.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.ImportLibrary._M_dataplus._M_p != &local_118.ImportLibrary.field_2) {
      operator_delete(local_118.ImportLibrary._M_dataplus._M_p,
                      local_118.ImportLibrary.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Real._M_dataplus._M_p != &local_118.Real.field_2) {
      operator_delete(local_118.Real._M_dataplus._M_p,
                      local_118.Real.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Output._M_dataplus._M_p != &local_118.Output.field_2) {
      operator_delete(local_118.Output._M_dataplus._M_p,
                      local_118.Output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.Base._M_dataplus._M_p == &local_118.Base.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_118.Base._M_dataplus._M_p,local_118.Base.field_2._M_allocated_capacity + 1
                   );
    return __return_storage_ptr__;
  }
  pIVar5 = GetImportInfo(this,config);
  if (pIVar5 == (ImportInfo *)0x0) goto LAB_0034f210;
  if (pIVar5->NoSOName == true) {
    cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar5->Location);
  }
  else {
    bVar3 = IsFrameworkOnApple(this);
    if (bVar3) {
      memset(&local_118,0,0xa8);
      bVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         (pIVar5->SOName)._M_dataplus._M_p,(RegularExpressionMatch *)&local_118);
      if (bVar3) {
        if (local_118.Base.field_2._M_allocated_capacity == 0) {
          local_138 = &local_128;
          local_130 = 0;
          local_128 = '\0';
        }
        else {
          local_138 = &local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,local_118.Base.field_2._M_allocated_capacity,
                     local_118.ImportLibrary._M_dataplus._M_p);
        }
        if (local_118.Base.field_2._8_8_ == 0) {
          local_158 = &local_148;
          local_150 = 0;
          local_148 = 0;
        }
        else {
          local_158 = &local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,local_118.Base.field_2._8_8_,
                     local_118.ImportLibrary._M_string_length);
        }
        local_58._M_len = local_130;
        local_58._M_str = local_138;
        local_48 = 0xb;
        local_40 = ".framework/";
        local_38 = local_150;
        local_30 = local_158;
        views._M_len = 3;
        views._M_array = &local_58;
        cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
        if (local_158 != &local_148) {
          operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
        }
        if (bVar3) goto LAB_0034f20b;
      }
    }
    local_118.Base._M_string_length = (size_type)(pIVar5->SOName)._M_dataplus._M_p;
    local_118.Base._M_dataplus._M_p = (pointer)(pIVar5->SOName)._M_string_length;
    __str._M_str = "@rpath/";
    __str._M_len = 7;
    iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_118,0,7,__str);
    if (iVar4 == 0) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&pIVar5->SOName);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pIVar5->SOName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pIVar5->SOName)._M_string_length)
      ;
    }
  }
LAB_0034f20b:
  if (pIVar5 != (ImportInfo *)0x0) {
    return __return_storage_ptr__;
  }
LAB_0034f210:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (this->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(info->SOName.c_str(), match)) {
          auto frameworkName = match.match(2);
          auto fileName = match.match(3);
          return cmStrCat(frameworkName, ".framework/", fileName);
        }
      }
      if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
        return info->SOName.substr(cmStrLen("@rpath/"));
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}